

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
          (RepeatedPtrFieldBase *this)

{
  int v1;
  int v2;
  char *failure_msg;
  LogMessage *pLVar1;
  LogMessage local_38;
  Voidify local_21;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  RepeatedPtrFieldBase *pRStack_10;
  int n;
  RepeatedPtrFieldBase *this_local;
  
  absl_log_internal_check_op_result._4_4_ = this->current_size_;
  pRStack_10 = this;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue
                 (absl_log_internal_check_op_result._4_4_);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_20 = absl::lts_20250127::log_internal::Check_GEImpl(v1,v2,"n >= 0");
  if (local_20 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_20);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x130,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  if (0 < absl_log_internal_check_op_result._4_4_) {
    ClearNonEmpty<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
              (this);
  }
  return;
}

Assistant:

void Clear() {
    const int n = current_size_;
    ABSL_DCHECK_GE(n, 0);
    if (n > 0) {
      using H = CommonHandler<TypeHandler>;
      ClearNonEmpty<H>();
    }
  }